

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Vec_Int_t *
Saig_ManExtendCounterExampleTest3(Aig_Man_t *pAig,int iFirstFlopPi,Abc_Cex_t *pCex,int fVerbose)

{
  int iVar1;
  Saig_RefMan_t *p;
  Aig_Man_t *pAVar2;
  Vec_Int_t *vReasons;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  int level;
  timespec ts;
  timespec local_40;
  
  if (pAig->nTruePis == pCex->nPis) {
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar4 = 1;
    }
    else {
      lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
      lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
    }
    p = (Saig_RefMan_t *)calloc(1,0x28);
    p->pAig = pAig;
    p->pCex = pCex;
    p->nInputs = iFirstFlopPi;
    p->fVerbose = fVerbose;
    pAVar2 = Saig_ManUnrollWithCex(pAig,pCex,iFirstFlopPi,&p->vMapPiF2A);
    p->pFrames = pAVar2;
    vReasons = Saig_RefManFindReason(p);
    pVVar3 = Saig_RefManReason2Inputs(p,vReasons);
    iVar1 = 0x8ff7c9;
    printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
           (ulong)(uint)pAVar2->nObjs[2],(ulong)(uint)vReasons->nSize,
           (ulong)(uint)(p->pAig->nTruePis - p->nInputs),(ulong)(uint)pVVar3->nSize);
    Abc_Print(iVar1,"%s =","Time");
    level = 3;
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    if (vReasons->pArray != (int *)0x0) {
      free(vReasons->pArray);
    }
    free(vReasons);
    Saig_RefManStop(p);
  }
  else {
    pVVar3 = (Vec_Int_t *)0x0;
    printf("Saig_ManExtendCounterExampleTest3(): The PI count of AIG (%d) does not match that of cex (%d).\n"
           ,(ulong)(uint)pAig->nObjs[2]);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Saig_ManExtendCounterExampleTest3( Aig_Man_t * pAig, int iFirstFlopPi, Abc_Cex_t * pCex, int fVerbose )
{
    Saig_RefMan_t * p;
    Vec_Int_t * vRes, * vReasons;
    abctime clk;
    if ( Saig_ManPiNum(pAig) != pCex->nPis )
    {
        printf( "Saig_ManExtendCounterExampleTest3(): The PI count of AIG (%d) does not match that of cex (%d).\n", 
            Aig_ManCiNum(pAig), pCex->nPis );
        return NULL;
    }

clk = Abc_Clock();

    p = Saig_RefManStart( pAig, pCex, iFirstFlopPi, fVerbose );
    vReasons = Saig_RefManFindReason( p );
    vRes = Saig_RefManReason2Inputs( p, vReasons );

//    if ( fVerbose )
    {
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

/*
    ////////////////////////////////////
    Vec_IntFree( vReasons );
    vReasons = Saig_RefManRefineWithSat( p, vRes );
    ////////////////////////////////////

    // derive new result
    Vec_IntFree( vRes );
    vRes = Saig_RefManReason2Inputs( p, vReasons );
//    if ( fVerbose )
    {
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }
*/

    Vec_IntFree( vReasons );
    Saig_RefManStop( p );
    return vRes;
}